

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O1

uint8_t * __thiscall
flatbuffers::Allocator::reallocate_downward
          (Allocator *this,uint8_t *old_p,size_t old_size,size_t new_size,size_t in_use_back,
          size_t in_use_front)

{
  int iVar1;
  undefined4 extraout_var;
  uint8_t *__dest;
  
  if (old_size < new_size) {
    iVar1 = (*this->_vptr_Allocator[2])(this,new_size);
    __dest = (uint8_t *)CONCAT44(extraout_var,iVar1);
    memcpy(__dest + (new_size - in_use_back),old_p + (old_size - in_use_back),in_use_back);
    memcpy(__dest,old_p,in_use_front);
    (*this->_vptr_Allocator[3])(this,old_p,old_size);
    return __dest;
  }
  __assert_fail("new_size > old_size",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/allocator.h"
                ,0x2c,
                "virtual uint8_t *flatbuffers::Allocator::reallocate_downward(uint8_t *, size_t, size_t, size_t, size_t)"
               );
}

Assistant:

virtual uint8_t *reallocate_downward(uint8_t *old_p, size_t old_size,
                                       size_t new_size, size_t in_use_back,
                                       size_t in_use_front) {
    FLATBUFFERS_ASSERT(new_size > old_size);  // vector_downward only grows
    uint8_t *new_p = allocate(new_size);
    memcpy_downward(old_p, old_size, new_p, new_size, in_use_back,
                    in_use_front);
    deallocate(old_p, old_size);
    return new_p;
  }